

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

MetadataResult SetMaxWidth(ShellState *state,char **azArg,idx_t nArg)

{
  size_t sVar1;
  MetadataResult MVar2;
  
  MVar2 = PRINT_USAGE;
  if (nArg < 3) {
    if (nArg == 1) {
      MVar2 = SUCCESS;
      fprintf((FILE *)state->out,"current max rows: %zu\n",state->max_width);
    }
    else {
      sVar1 = integerValue(azArg[1]);
      state->max_width = sVar1;
      MVar2 = SUCCESS;
    }
  }
  return MVar2;
}

Assistant:

MetadataResult SetMaxWidth(ShellState &state, const char **azArg, idx_t nArg) {
	if (nArg > 2) {
		return MetadataResult::PRINT_USAGE;
	}
	if (nArg == 1) {
		raw_printf(state.out, "current max rows: %zu\n", state.max_width);
	} else {
		state.max_width = (size_t)integerValue(azArg[1]);
	}
	return MetadataResult::SUCCESS;
}